

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cc
# Opt level: O0

ostream * lf::mesh::operator<<(ostream *stream,Entity *entity)

{
  int iVar1;
  ostream *poVar2;
  RefEl local_19;
  Entity *local_18;
  Entity *entity_local;
  ostream *stream_local;
  
  local_18 = entity;
  entity_local = (Entity *)stream;
  iVar1 = (*entity->_vptr_Entity[4])();
  local_19.type_ = (RefElType)iVar1;
  poVar2 = lf::base::operator<<(stream,&local_19);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const lf::mesh::Entity& entity) {
  return stream << entity.RefEl();
}